

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

size_t testing::internal::GetThreadCount(void)

{
  int iVar1;
  Message *pMVar2;
  __pid_t local_34;
  Message local_30;
  undefined1 local_28 [8];
  string filename;
  
  Message::Message(&local_30);
  pMVar2 = Message::operator<<(&local_30,(char (*) [7])"/proc/");
  local_34 = getpid();
  pMVar2 = Message::operator<<(pMVar2,&local_34);
  pMVar2 = Message::operator<<(pMVar2,(char (*) [6])"/stat");
  Message::GetString_abi_cxx11_((string *)local_28,pMVar2);
  Message::~Message(&local_30);
  iVar1 = anon_unknown_88::ReadProcFileField<int>((string *)local_28,0x13);
  std::__cxx11::string::~string((string *)local_28);
  return (long)iVar1;
}

Assistant:

size_t GetThreadCount() {
  const std::string filename =
      (Message() << "/proc/" << getpid() << "/stat").GetString();
  return ReadProcFileField<int>(filename, 19);
}